

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O3

quad_lookup_t *
quad_lookup_create(quad_lookup_t *__return_storage_ptr__,uint rate,uint order,uint *table)

{
  int iVar1;
  byte bVar2;
  distance_quad_key_t *pdVar3;
  output_quad_t *poVar4;
  void *__ptr;
  ulong uVar5;
  distance_quad_t *pdVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar8 = 1 << ((char)order - 2U & 0x1f);
  uVar9 = (ulong)uVar8;
  uVar10 = 1;
  pdVar3 = (distance_quad_key_t *)malloc((long)(int)uVar8 << 2);
  __return_storage_ptr__->keys = pdVar3;
  bVar2 = (byte)rate;
  uVar5 = (ulong)(uint)(1 << (bVar2 * '\x04' & 0x1f));
  poVar4 = (output_quad_t *)calloc(uVar5,4);
  __return_storage_ptr__->outputs = poVar4;
  __ptr = calloc(uVar5,4);
  uVar5 = 0;
  do {
    iVar1 = (int)uVar5;
    uVar7 = ((table[iVar1 + 3] << (bVar2 & 0x1f) | table[iVar1 + 2]) << (bVar2 & 0x1f) |
            table[iVar1 + 1]) << (bVar2 & 0x1f) | table[uVar5 & 0xffffffff];
    uVar8 = *(uint *)((long)__ptr + (ulong)uVar7 * 4);
    if (uVar8 == 0) {
      *(uint *)((long)__ptr + (ulong)uVar7 * 4) = uVar10;
      poVar4[uVar10] = uVar7;
      uVar8 = uVar10;
      uVar10 = uVar10 + 1;
    }
    *(uint *)((long)pdVar3 + uVar5) = uVar8;
    uVar5 = uVar5 + 4;
    uVar9 = uVar9 - 1;
  } while (uVar9 != 0);
  __return_storage_ptr__->outputs_len = (ulong)uVar10;
  __return_storage_ptr__->output_mask = ~(-1 << (bVar2 & 0x1f));
  __return_storage_ptr__->output_width = rate;
  pdVar6 = (distance_quad_t *)calloc((ulong)uVar10,8);
  __return_storage_ptr__->distances = pdVar6;
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

quad_lookup_t quad_lookup_create(unsigned int rate,
                                 unsigned int order,
                                 const unsigned int *table) {
    quad_lookup_t quads;

    quads.keys = malloc(sizeof(unsigned int) * (1 << (order - 2)));
    quads.outputs = calloc((1 << (rate * 4)), sizeof(unsigned int));
    unsigned int *inv_outputs = calloc((1 << (rate * 4)), sizeof(unsigned int));
    unsigned int output_counter = 1;
    // for every (even-numbered) shift register state, find the concatenated output of the state
    //   and the subsequent state that follows it (low bit set). then, check to see if this
    //   concatenated output has a unique key assigned to it already. if not, give it a key.
    //   if it does, retrieve the key. assign this key to the shift register state.
    for (unsigned int i = 0; i < (1 << (order - 2)); i++) {
        // first get the concatenated quad of outputs
        unsigned int out = table[i * 4 + 3];
        out <<= rate;
        out |= table[i * 4 + 2];
        out <<= rate;
        out |= table[i * 4 + 1];
        out <<= rate;
        out |= table[i * 4];

        // does this concatenated output exist in the outputs table yet?
        if (!inv_outputs[out]) {
            // doesn't exist, allocate a new key
            inv_outputs[out] = output_counter;
            quads.outputs[output_counter] = out;
            output_counter++;
        }
        // set the opaque key for the ith shift register state to the concatenated output entry
        quads.keys[i] = inv_outputs[out];
    }
    quads.outputs_len = output_counter;
    quads.output_mask = (1 << (rate)) - 1;
    quads.output_width = rate;
    quads.distances = calloc(quads.outputs_len, sizeof(distance_quad_t));
    free(inv_outputs);
    return quads;
}